

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Promise<void> __thiscall kj::TaskSet::onEmpty(TaskSet *this)

{
  SourceLocation location;
  char cVar1;
  long in_RSI;
  Fault f;
  Fault local_40 [2];
  PromiseFulfiller<void> *in_stack_ffffffffffffffd0;
  Disposer *in_stack_ffffffffffffffd8;
  PromiseFulfiller<void> *in_stack_ffffffffffffffe0;
  
  if (*(long **)(in_RSI + 0x18) != (long *)0x0) {
    cVar1 = (**(code **)(**(long **)(in_RSI + 0x18) + 8))();
    if (cVar1 != '\0') {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x18b,FAILED,(char *)0x0,"\"onEmpty() can only be called once at a time\"",
                 (char (*) [44])"onEmpty() can only be called once at a time");
      kj::_::Debug::Fault::fatal(local_40);
    }
  }
  if (*(long *)(in_RSI + 8) == 0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    location.function = (char *)in_stack_ffffffffffffffd8;
    location.fileName = (char *)in_stack_ffffffffffffffd0;
    location._16_8_ = in_stack_ffffffffffffffe0;
    newPromiseAndFulfiller<void>(location);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0x10),
               (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&stack0xffffffffffffffd8);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&stack0xffffffffffffffd8);
    this->errorHandler = (ErrorHandler *)local_40[0].exception;
    local_40[0].exception = (Exception *)0x0;
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_40);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> TaskSet::onEmpty() {
  KJ_IF_SOME(fulfiller, emptyFulfiller) {
    if (fulfiller->isWaiting()) {
      KJ_FAIL_REQUIRE("onEmpty() can only be called once at a time");
    }
  }

  if (tasks == kj::none) {
    return READY_NOW;
  } else {
    auto paf = newPromiseAndFulfiller<void>();
    emptyFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}